

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::htmlCodeReplacement(string *unit_string)

{
  size_type sVar1;
  size_type unaff_retaddr;
  size_type fnd;
  size_type in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  undefined8 local_10;
  
  local_10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  (char *)fnd,unaff_retaddr);
  while (local_10 != 0xffffffffffffffff) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (in_stack_00000020,in_stack_00000018,(size_type)unit_string,(char *)fnd);
    sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 (char *)fnd,unaff_retaddr);
    if (sVar1 == 0xffffffffffffffff) {
      sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   (char *)fnd,unaff_retaddr);
      if (sVar1 != 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace(in_stack_00000020,in_stack_00000018,(size_type)unit_string,(char *)fnd);
      }
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (in_stack_00000020,in_stack_00000018,(size_type)unit_string,(char *)fnd);
    }
    local_10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,(char *)fnd,unaff_retaddr);
  }
  local_10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  (char *)fnd,unaff_retaddr);
  while (local_10 != 0xffffffffffffffff) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (in_stack_00000020,in_stack_00000018,(size_type)unit_string,(char *)fnd);
    sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 (char *)fnd,unaff_retaddr);
    if (sVar1 == 0xffffffffffffffff) {
      sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   (char *)fnd,unaff_retaddr);
      if (sVar1 != 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace(in_stack_00000020,in_stack_00000018,(size_type)unit_string,(char *)fnd);
      }
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (in_stack_00000020,in_stack_00000018,(size_type)unit_string,(char *)fnd);
    }
    local_10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,(char *)fnd,unaff_retaddr);
  }
  return;
}

Assistant:

static void htmlCodeReplacement(std::string& unit_string)
{
    auto fnd = unit_string.find("<sup>");
    while (fnd != std::string::npos) {
        unit_string.replace(fnd, 5, "^");
        fnd = unit_string.find("</sup>");
        if (fnd != std::string::npos) {
            unit_string.replace(fnd, 6, "");
        } else {
            fnd = unit_string.find("<\\/sup>");
            if (fnd != std::string::npos) {
                unit_string.replace(fnd, 8, "");
            }
        }
        fnd = unit_string.find("<sup>");
    }
    fnd = unit_string.find("<sub>");
    while (fnd != std::string::npos) {
        unit_string.replace(fnd, 5, "_");
        fnd = unit_string.find("</sub>");
        if (fnd != std::string::npos) {
            unit_string.replace(fnd, 6, "");
        } else {
            fnd = unit_string.find("<\\/sub>");
            if (fnd != std::string::npos) {
                unit_string.replace(fnd, 8, "");
            }
        }
        fnd = unit_string.find("<sub>");
    }
}